

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall wallet::DescriptorScriptPubKeyMan::TopUp(DescriptorScriptPubKeyMan *this,uint size)

{
  undefined1 uVar1;
  byte bVar2;
  bool bVar3;
  runtime_error *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  bool res;
  uint in_stack_00000044;
  undefined4 in_stack_00000048;
  WalletBatch batch;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  WalletBatch *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 uVar4;
  bool local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(**(long **)(in_RDI + 8) + 0x18))();
  args = &local_58;
  WalletBatch::WalletBatch
            (in_stack_ffffffffffffff58,
             (WalletDatabase *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             (bool)in_stack_ffffffffffffff4f);
  uVar1 = WalletBatch::TxnBegin
                    ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  if ((bool)uVar1) {
    bVar2 = TopUpWithDB(this,(WalletBatch *)CONCAT44(size,in_stack_00000048),in_stack_00000044);
    bVar3 = WalletBatch::TxnCommit
                      ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48))
    ;
    if (!bVar3) {
      uVar4 = 1;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))(&local_58.field_2);
      tinyformat::format<std::__cxx11::string>
                ((char *)CONCAT17(bVar2,CONCAT16(uVar4,CONCAT15(uVar1,in_stack_ffffffffffffff78))),
                 args);
      std::runtime_error::runtime_error(this_00,local_28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00403a72;
    }
    local_59 = (bool)(bVar2 & 1);
  }
  else {
    local_59 = false;
  }
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_59;
  }
LAB_00403a72:
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::TopUp(unsigned int size)
{
    WalletBatch batch(m_storage.GetDatabase());
    if (!batch.TxnBegin()) return false;
    bool res = TopUpWithDB(batch, size);
    if (!batch.TxnCommit()) throw std::runtime_error(strprintf("Error during descriptors keypool top up. Cannot commit changes for wallet %s", m_storage.GetDisplayName()));
    return res;
}